

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

int copyEntityTable(HASH_TABLE *newTable,STRING_POOL *newPool,HASH_TABLE *oldTable,XML_Parser parser
                   )

{
  XML_Char XVar1;
  NAMED **ppNVar2;
  KEY pXVar3;
  NAMED ***pppNVar4;
  int iVar5;
  XML_Char *pXVar6;
  NAMED *pNVar7;
  int iVar8;
  NAMED *pNVar9;
  KEY local_48;
  NAMED *local_40;
  
  pppNVar4 = &oldTable->v;
  local_48 = (KEY)0x0;
  local_40 = (NAMED *)0x0;
  do {
    do {
      if (oldTable == (HASH_TABLE *)(pppNVar4 + (long)parser)) {
        return 1;
      }
      ppNVar2 = oldTable->v;
      oldTable = (HASH_TABLE *)&oldTable->size;
    } while (ppNVar2 == (NAMED **)0x0);
    pXVar6 = poolCopyString(newPool,(XML_Char *)*ppNVar2);
    if (pXVar6 == (XML_Char *)0x0) {
      return 0;
    }
    pNVar7 = lookup(newTable,pXVar6,0x40);
    if (pNVar7 == (NAMED *)0x0) {
      return 0;
    }
    if (ppNVar2[3] == (NAMED *)0x0) {
      pNVar9 = ppNVar2[1];
      iVar8 = *(int *)(ppNVar2 + 2);
      if ((newPool->ptr == (XML_Char *)0x0) && (iVar5 = poolGrow(newPool), iVar5 == 0)) {
        return 0;
      }
      if (0 < iVar8) {
        iVar8 = iVar8 + 1;
        do {
          pXVar6 = newPool->ptr;
          if (pXVar6 == newPool->end) {
            iVar5 = poolGrow(newPool);
            if (iVar5 == 0) {
              return 0;
            }
            pXVar6 = newPool->ptr;
          }
          XVar1 = *(XML_Char *)&pNVar9->name;
          newPool->ptr = pXVar6 + 1;
          *pXVar6 = XVar1;
          pNVar9 = (NAMED *)((long)&pNVar9->name + 1);
          iVar8 = iVar8 + -1;
        } while (1 < iVar8);
      }
      pXVar3 = newPool->start;
      newPool->start = newPool->ptr;
      if (pXVar3 == (KEY)0x0) {
        return 0;
      }
      pNVar7[1].name = pXVar3;
      *(undefined4 *)&pNVar7[2].name = *(undefined4 *)(ppNVar2 + 2);
    }
    else {
      pXVar6 = poolCopyString(newPool,(XML_Char *)ppNVar2[3]);
      if (pXVar6 == (XML_Char *)0x0) {
        return 0;
      }
      pNVar7[3].name = pXVar6;
      pNVar9 = ppNVar2[4];
      if (pNVar9 != (NAMED *)0x0) {
        if (pNVar9 == local_40) {
          pNVar7[4].name = local_48;
        }
        else {
          local_48 = poolCopyString(newPool,(XML_Char *)pNVar9);
          if (local_48 == (XML_Char *)0x0) {
            return 0;
          }
          pNVar7[4].name = local_48;
          local_40 = pNVar9;
        }
      }
    }
    if (ppNVar2[6] != (NAMED *)0x0) {
      pXVar6 = poolCopyString(newPool,(XML_Char *)ppNVar2[6]);
      if (pXVar6 == (XML_Char *)0x0) {
        return 0;
      }
      pNVar7[6].name = pXVar6;
    }
  } while( true );
}

Assistant:

static int copyEntityTable(HASH_TABLE *newTable,
                           STRING_POOL *newPool,
                           const HASH_TABLE *oldTable,
                           XML_Parser parser)
{
  HASH_TABLE_ITER iter;
  const XML_Char *cachedOldBase = 0;
  const XML_Char *cachedNewBase = 0;
  cmExpatUnused(parser);

  hashTableIterInit(&iter, oldTable);

  for (;;) {
    ENTITY *newE;
    const XML_Char *name;
    const ENTITY *oldE = (ENTITY *)hashTableIterNext(&iter);
    if (!oldE)
      break;
    name = poolCopyString(newPool, oldE->name);
    if (!name)
      return 0;
    newE = (ENTITY *)lookup(newTable, name, sizeof(ENTITY));
    if (!newE)
      return 0;
    if (oldE->systemId) {
      const XML_Char *tem = poolCopyString(newPool, oldE->systemId);
      if (!tem)
        return 0;
      newE->systemId = tem;
      if (oldE->base) {
        if (oldE->base == cachedOldBase)
          newE->base = cachedNewBase;
        else {
          cachedOldBase = oldE->base;
          tem = poolCopyString(newPool, cachedOldBase);
          if (!tem)
            return 0;
          cachedNewBase = newE->base = tem;
        }
      }
    }
    else {
      const XML_Char *tem = poolCopyStringN(newPool, oldE->textPtr, oldE->textLen);
      if (!tem)
        return 0;
      newE->textPtr = tem;
      newE->textLen = oldE->textLen;
    }
    if (oldE->notation) {
      const XML_Char *tem = poolCopyString(newPool, oldE->notation);
      if (!tem)
        return 0;
      newE->notation = tem;
    }
  }
  return 1;
}